

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_parser.cpp
# Opt level: O0

void __thiscall cmd_paresr::cmd_paresr(cmd_paresr *this,int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int local_84;
  undefined1 local_80 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> tmp;
  int i;
  char **argv_local;
  int argc_local;
  cmd_paresr *this_local;
  
  std::queue<char,std::deque<char,std::allocator<char>>>::
  queue<std::deque<char,std::allocator<char>>,void>
            ((queue<char,std::deque<char,std::allocator<char>>> *)&this->ops);
  std::
  queue<std::queue<int,std::deque<int,std::allocator<int>>>,std::deque<std::queue<int,std::deque<int,std::allocator<int>>>,std::allocator<std::queue<int,std::deque<int,std::allocator<int>>>>>>
  ::
  queue<std::deque<std::queue<int,std::deque<int,std::allocator<int>>>,std::allocator<std::queue<int,std::deque<int,std::allocator<int>>>>>,void>
            ((queue<std::queue<int,std::deque<int,std::allocator<int>>>,std::deque<std::queue<int,std::deque<int,std::allocator<int>>>,std::allocator<std::queue<int,std::deque<int,std::allocator<int>>>>>>
              *)&this->args);
  this->pos = 0;
  this->opnum = 0;
  for (tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
       _M_node._0_4_ = 1;
      (int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node < argc;
      tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_node._0_4_ =
           (int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node + 1) {
    std::queue<char,_std::deque<char,_std::allocator<char>_>_>::push
              (&this->ops,
               argv[(int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node] + 1);
    std::queue<int,std::deque<int,std::allocator<int>>>::
    queue<std::deque<int,std::allocator<int>>,void>
              ((queue<int,std::deque<int,std::allocator<int>>> *)local_80);
    this->opnum = this->opnum + 1;
    tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node._0_4_ =
         (int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node + 1;
    while( true ) {
      bVar2 = false;
      if ((int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_node < argc) {
        bVar2 = *argv[(int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node] != '-';
      }
      if (!bVar2) break;
      lVar1 = (long)(int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node;
      tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_node._0_4_ =
           (int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node + 1;
      local_84 = atoi(argv[lVar1]);
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_80,&local_84);
    }
    std::
    queue<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::deque<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>_>
    ::push(&this->args,(value_type *)local_80);
    tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node._0_4_ =
         (int)tmp.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node + -1;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_80);
  }
  return;
}

Assistant:

cmd_paresr::cmd_paresr(int argc, char **argv) {
  pos = 0;
  opnum = 0;
  for (int i = 1; i < argc; i++) {
    // Set operation
    ops.push(argv[i][1]);
    queue<int> tmp;
    opnum++;
    i++;
    // Get args
    while (i < argc && argv[i][0] != '-')
      tmp.push(atoi(argv[i++]));
    // Set args
    args.push(tmp);
    i--;
  }
}